

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagger.cpp
# Opt level: O3

Tagger * MeCab::createTagger(int argc,char **argv)

{
  _func_int **pp_Var1;
  int iVar2;
  Tagger *pTVar3;
  ModelImpl *this;
  undefined4 extraout_var;
  
  pTVar3 = (Tagger *)operator_new(0x60);
  pTVar3->_vptr_Tagger = (_func_int **)&PTR_parse_00140550;
  pTVar3[1]._vptr_Tagger = (_func_int **)0x0;
  pTVar3[2]._vptr_Tagger = (_func_int **)&PTR__scoped_ptr_00140838;
  pTVar3[3]._vptr_Tagger = (_func_int **)0x0;
  pTVar3[4]._vptr_Tagger = (_func_int **)&PTR__scoped_ptr_00140878;
  pTVar3[5]._vptr_Tagger = (_func_int **)0x0;
  *(undefined4 *)&pTVar3[6]._vptr_Tagger = 1;
  pTVar3[7]._vptr_Tagger = (_func_int **)0x3fe8000000000000;
  pTVar3[8]._vptr_Tagger = (_func_int **)(pTVar3 + 10);
  pTVar3[9]._vptr_Tagger = (_func_int **)0x0;
  *(undefined1 *)&pTVar3[10]._vptr_Tagger = 0;
  this = (ModelImpl *)operator_new(0x30);
  anon_unknown_0::ModelImpl::ModelImpl(this);
  if (pTVar3[3]._vptr_Tagger != (_func_int **)0x0) {
    (**(code **)(*pTVar3[3]._vptr_Tagger + 0x38))();
  }
  pTVar3[3]._vptr_Tagger = (_func_int **)this;
  iVar2 = anon_unknown_0::ModelImpl::open(this,argc,(int)argv);
  pp_Var1 = pTVar3[3]._vptr_Tagger;
  if ((char)iVar2 == '\0') {
    if (pp_Var1 != (_func_int **)0x0) {
      (**(code **)(*pp_Var1 + 0x38))();
    }
    pTVar3[3]._vptr_Tagger = (_func_int **)0x0;
    iVar2 = (*pTVar3->_vptr_Tagger[0x1b])(pTVar3);
    setGlobalError((char *)CONCAT44(extraout_var,iVar2));
    (*pTVar3->_vptr_Tagger[0x1d])(pTVar3);
    pTVar3 = (Tagger *)0x0;
  }
  else {
    pTVar3[1]._vptr_Tagger = pp_Var1;
    *(undefined4 *)&pTVar3[6]._vptr_Tagger = *(undefined4 *)(pp_Var1 + 4);
    pTVar3[7]._vptr_Tagger = (_func_int **)pp_Var1[5];
  }
  return pTVar3;
}

Assistant:

Tagger *createTagger(int argc, char **argv) {
  TaggerImpl *tagger = new TaggerImpl();
  if (!tagger->open(argc, argv)) {
    setGlobalError(tagger->what());
    delete tagger;
    return 0;
  }
  return tagger;
}